

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  string *psVar3;
  ulong uVar4;
  test_app *this;
  ostream *poVar5;
  test_app *this_00;
  long in_RSI;
  int in_EDI;
  exception *e;
  test_app app;
  service srv;
  test_app *in_stack_000003d0;
  value cfg;
  bool separate;
  string type;
  test_app *in_stack_00001910;
  value *in_stack_fffffffffffff638;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff648;
  value *in_stack_fffffffffffff650;
  allocator *in_stack_fffffffffffff768;
  test_app *in_stack_fffffffffffff770;
  test_app *in_stack_fffffffffffff7c0;
  test_app *this_01;
  test_app *in_stack_fffffffffffff960;
  service local_680 [15];
  allocator local_671;
  string local_670 [39];
  allocator local_649;
  string local_648 [36];
  undefined4 local_624;
  allocator local_611;
  string local_610 [39];
  allocator local_5e9;
  string local_5e8 [47];
  allocator local_5b9;
  string local_5b8 [39];
  allocator local_591;
  string local_590 [47];
  allocator local_561;
  string local_560 [39];
  allocator local_539;
  string local_538 [47];
  allocator local_509;
  string local_508 [39];
  allocator local_4e1;
  string local_4e0 [47];
  allocator local_4b1;
  string local_4b0 [39];
  allocator local_489;
  string local_488 [8];
  test_app *in_stack_fffffffffffffb80;
  allocator local_459;
  string local_458 [39];
  allocator local_431;
  string local_430 [47];
  allocator local_401;
  test_app *in_stack_fffffffffffffc00;
  allocator local_3d9;
  string local_3d8 [47];
  allocator local_3a9;
  string local_3a8 [39];
  allocator local_381;
  string local_380 [47];
  allocator local_351;
  string local_350 [39];
  allocator local_329;
  string local_328 [47];
  allocator local_2f9;
  string local_2f8 [39];
  allocator local_2d1;
  string local_2d0 [16];
  test_app *in_stack_fffffffffffffd40;
  allocator<char> local_2a1;
  string local_2a0 [39];
  allocator local_279;
  string local_278 [24];
  test_app *in_stack_fffffffffffffda0;
  allocator local_251;
  string local_250 [47];
  allocator local_221;
  string local_220 [32];
  test_app *in_stack_fffffffffffffe00;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [47];
  allocator local_1a1;
  string local_1a0 [39];
  allocator local_179;
  string local_178 [39];
  allocator local_151;
  string local_150 [39];
  allocator local_129;
  string local_128 [47];
  allocator local_f9;
  string local_f8 [39];
  allocator local_d1;
  string local_d0 [47];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [40];
  value local_50;
  byte local_41;
  undefined4 local_40;
  string local_30 [32];
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::__cxx11::string::string(local_30);
  if (local_8 == 3) {
    std::__cxx11::string::operator=(local_30,*(char **)(local_10 + 8));
    bVar2 = std::operator!=(in_stack_fffffffffffff640,(char *)in_stack_fffffffffffff638);
    if ((!bVar2) ||
       (bVar2 = std::operator!=(in_stack_fffffffffffff640,(char *)in_stack_fffffffffffff638), !bVar2
       )) {
      local_41 = std::operator==(in_stack_fffffffffffff640,(char *)in_stack_fffffffffffff638);
      cppcms::json::value::value((value *)0x119213);
      cppcms::json::value::value<char[3]>
                (in_stack_fffffffffffff650,(char (*) [3])in_stack_fffffffffffff648);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,"views",&local_79);
      psVar3 = (string *)cppcms::json::value::operator[]((string *)&local_50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a0,"paths",&local_a1);
      uVar4 = cppcms::json::value::operator[](psVar3);
      cppcms::json::value::operator[](uVar4);
      cppcms::json::value::operator=((value *)in_stack_fffffffffffff640,in_stack_fffffffffffff638);
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
      cppcms::json::value::~value((value *)0x119342);
      cppcms::json::value::value<char[12]>
                (in_stack_fffffffffffff650,(char (*) [12])in_stack_fffffffffffff648);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d0,"localization",&local_d1);
      psVar3 = (string *)cppcms::json::value::operator[]((string *)&local_50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f8,"locales",&local_f9);
      uVar4 = cppcms::json::value::operator[](psVar3);
      cppcms::json::value::operator[](uVar4);
      cppcms::json::value::operator=((value *)in_stack_fffffffffffff640,in_stack_fffffffffffff638);
      std::__cxx11::string::~string(local_f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_f9);
      std::__cxx11::string::~string(local_d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_d1);
      cppcms::json::value::~value((value *)0x11946f);
      pcVar1 = *(char **)(local_10 + 0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_128,pcVar1,&local_129);
      cppcms::json::value::value<std::__cxx11::string>
                (in_stack_fffffffffffff650,in_stack_fffffffffffff648);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_150,"localization",&local_151);
      psVar3 = (string *)cppcms::json::value::operator[]((string *)&local_50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_178,"messages",&local_179);
      psVar3 = (string *)cppcms::json::value::operator[](psVar3);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1a0,"paths",&local_1a1);
      uVar4 = cppcms::json::value::operator[](psVar3);
      cppcms::json::value::operator[](uVar4);
      cppcms::json::value::operator=((value *)in_stack_fffffffffffff640,in_stack_fffffffffffff638);
      std::__cxx11::string::~string(local_1a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
      std::__cxx11::string::~string(local_178);
      std::allocator<char>::~allocator((allocator<char> *)&local_179);
      std::__cxx11::string::~string(local_150);
      std::allocator<char>::~allocator((allocator<char> *)&local_151);
      cppcms::json::value::~value((value *)0x119651);
      std::__cxx11::string::~string(local_128);
      std::allocator<char>::~allocator((allocator<char> *)&local_129);
      cppcms::json::value::value<char[5]>
                (in_stack_fffffffffffff650,(char (*) [5])in_stack_fffffffffffff648);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1d0,"localization",&local_1d1);
      psVar3 = (string *)cppcms::json::value::operator[]((string *)&local_50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1f8,"messages",(allocator *)&stack0xfffffffffffffe07);
      psVar3 = (string *)cppcms::json::value::operator[](psVar3);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_220,"domains",&local_221);
      this = (test_app *)cppcms::json::value::operator[](psVar3);
      cppcms::json::value::operator[]((ulong)this);
      cppcms::json::value::operator=((value *)in_stack_fffffffffffff640,in_stack_fffffffffffff638);
      std::__cxx11::string::~string(local_220);
      std::allocator<char>::~allocator((allocator<char> *)&local_221);
      std::__cxx11::string::~string(local_1f8);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe07);
      std::__cxx11::string::~string(local_1d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
      cppcms::json::value::~value((value *)0x119804);
      cppcms::json::value::value<char[8]>
                (in_stack_fffffffffffff650,(char (*) [8])in_stack_fffffffffffff648);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_250,"localization",&local_251);
      psVar3 = (string *)cppcms::json::value::operator[]((string *)&local_50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_278,"messages",&local_279);
      psVar3 = (string *)cppcms::json::value::operator[](psVar3);
      this_01 = (test_app *)&local_2a1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2a0,"domains",(allocator *)this_01);
      uVar4 = cppcms::json::value::operator[](psVar3);
      cppcms::json::value::operator[](uVar4);
      cppcms::json::value::operator=((value *)in_stack_fffffffffffff640,in_stack_fffffffffffff638);
      std::__cxx11::string::~string(local_2a0);
      std::allocator<char>::~allocator(&local_2a1);
      std::__cxx11::string::~string(local_278);
      std::allocator<char>::~allocator((allocator<char> *)&local_279);
      std::__cxx11::string::~string(local_250);
      std::allocator<char>::~allocator((allocator<char> *)&local_251);
      cppcms::json::value::~value((value *)0x11999e);
      if ((local_41 & 1) == 0) {
        poVar5 = std::operator<<((ostream *)&std::cout,"Using shared header/body");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        cppcms::json::value::value<char[10]>
                  (in_stack_fffffffffffff650,(char (*) [10])in_stack_fffffffffffff648);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_488,"views",&local_489);
        psVar3 = (string *)cppcms::json::value::operator[]((string *)&local_50);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_4b0,"skins",&local_4b1);
        uVar4 = cppcms::json::value::operator[](psVar3);
        cppcms::json::value::operator[](uVar4);
        cppcms::json::value::operator=((value *)in_stack_fffffffffffff640,in_stack_fffffffffffff638)
        ;
        std::__cxx11::string::~string(local_4b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
        std::__cxx11::string::~string(local_488);
        std::allocator<char>::~allocator((allocator<char> *)&local_489);
        cppcms::json::value::~value((value *)0x11a8a3);
        cppcms::json::value::value<char[10]>
                  (in_stack_fffffffffffff650,(char (*) [10])in_stack_fffffffffffff648);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_4e0,"views",&local_4e1);
        psVar3 = (string *)cppcms::json::value::operator[]((string *)&local_50);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_508,"skins",&local_509);
        uVar4 = cppcms::json::value::operator[](psVar3);
        cppcms::json::value::operator[](uVar4);
        cppcms::json::value::operator=((value *)in_stack_fffffffffffff640,in_stack_fffffffffffff638)
        ;
        std::__cxx11::string::~string(local_508);
        std::allocator<char>::~allocator((allocator<char> *)&local_509);
        std::__cxx11::string::~string(local_4e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
        cppcms::json::value::~value((value *)0x11a9d1);
        cppcms::json::value::value<char[8]>
                  (in_stack_fffffffffffff650,(char (*) [8])in_stack_fffffffffffff648);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_538,"views",&local_539);
        psVar3 = (string *)cppcms::json::value::operator[]((string *)&local_50);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_560,"skins",&local_561);
        uVar4 = cppcms::json::value::operator[](psVar3);
        cppcms::json::value::operator[](uVar4);
        cppcms::json::value::operator=((value *)in_stack_fffffffffffff640,in_stack_fffffffffffff638)
        ;
        std::__cxx11::string::~string(local_560);
        std::allocator<char>::~allocator((allocator<char> *)&local_561);
        std::__cxx11::string::~string(local_538);
        std::allocator<char>::~allocator((allocator<char> *)&local_539);
        cppcms::json::value::~value((value *)0x11aaf9);
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cout,"Using separate header/body");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        cppcms::json::value::value<char[14]>
                  (in_stack_fffffffffffff650,(char (*) [14])in_stack_fffffffffffff648);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2d0,"views",&local_2d1);
        psVar3 = (string *)cppcms::json::value::operator[]((string *)&local_50);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2f8,"skins",&local_2f9);
        uVar4 = cppcms::json::value::operator[](psVar3);
        cppcms::json::value::operator[](uVar4);
        cppcms::json::value::operator=((value *)in_stack_fffffffffffff640,in_stack_fffffffffffff638)
        ;
        std::__cxx11::string::~string(local_2f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
        std::__cxx11::string::~string(local_2d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
        cppcms::json::value::~value((value *)0x119b0c);
        cppcms::json::value::value<char[14]>
                  (in_stack_fffffffffffff650,(char (*) [14])in_stack_fffffffffffff648);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_328,"views",&local_329);
        in_stack_fffffffffffff7c0 = (test_app *)cppcms::json::value::operator[]((string *)&local_50)
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_350,"skins",&local_351);
        uVar4 = cppcms::json::value::operator[]((string *)in_stack_fffffffffffff7c0);
        cppcms::json::value::operator[](uVar4);
        cppcms::json::value::operator=((value *)in_stack_fffffffffffff640,in_stack_fffffffffffff638)
        ;
        std::__cxx11::string::~string(local_350);
        std::allocator<char>::~allocator((allocator<char> *)&local_351);
        std::__cxx11::string::~string(local_328);
        std::allocator<char>::~allocator((allocator<char> *)&local_329);
        cppcms::json::value::~value((value *)0x119c3a);
        cppcms::json::value::value<char[12]>
                  (in_stack_fffffffffffff650,(char (*) [12])in_stack_fffffffffffff648);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_380,"views",&local_381);
        psVar3 = (string *)cppcms::json::value::operator[]((string *)&local_50);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3a8,"skins",&local_3a9);
        uVar4 = cppcms::json::value::operator[](psVar3);
        cppcms::json::value::operator[](uVar4);
        cppcms::json::value::operator=((value *)in_stack_fffffffffffff640,in_stack_fffffffffffff638)
        ;
        std::__cxx11::string::~string(local_3a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
        std::__cxx11::string::~string(local_380);
        std::allocator<char>::~allocator((allocator<char> *)&local_381);
        cppcms::json::value::~value((value *)0x119d68);
        cppcms::json::value::value<char[10]>
                  (in_stack_fffffffffffff650,(char (*) [10])in_stack_fffffffffffff648);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3d8,"views",&local_3d9);
        in_stack_fffffffffffff770 = (test_app *)cppcms::json::value::operator[]((string *)&local_50)
        ;
        in_stack_fffffffffffff768 = &local_401;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&stack0xfffffffffffffc00,"skins",in_stack_fffffffffffff768);
        uVar4 = cppcms::json::value::operator[]((string *)in_stack_fffffffffffff770);
        cppcms::json::value::operator[](uVar4);
        cppcms::json::value::operator=((value *)in_stack_fffffffffffff640,in_stack_fffffffffffff638)
        ;
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffc00);
        std::allocator<char>::~allocator((allocator<char> *)&local_401);
        std::__cxx11::string::~string(local_3d8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
        cppcms::json::value::~value((value *)0x119e96);
        cppcms::json::value::value<char[11]>
                  (in_stack_fffffffffffff650,(char (*) [11])in_stack_fffffffffffff648);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_430,"views",&local_431);
        psVar3 = (string *)cppcms::json::value::operator[]((string *)&local_50);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_458,"skins",&local_459);
        uVar4 = cppcms::json::value::operator[](psVar3);
        cppcms::json::value::operator[](uVar4);
        cppcms::json::value::operator=((value *)in_stack_fffffffffffff640,in_stack_fffffffffffff638)
        ;
        std::__cxx11::string::~string(local_458);
        std::allocator<char>::~allocator((allocator<char> *)&local_459);
        std::__cxx11::string::~string(local_430);
        std::allocator<char>::~allocator((allocator<char> *)&local_431);
        cppcms::json::value::~value((value *)0x119fc4);
      }
      cppcms::json::value::value<char[8]>
                (in_stack_fffffffffffff650,(char (*) [8])in_stack_fffffffffffff648);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_590,"views",&local_591);
      psVar3 = (string *)cppcms::json::value::operator[]((string *)&local_50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5b8,"default_skin",&local_5b9);
      cppcms::json::value::operator[](psVar3);
      cppcms::json::value::operator=((value *)in_stack_fffffffffffff640,in_stack_fffffffffffff638);
      std::__cxx11::string::~string(local_5b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
      std::__cxx11::string::~string(local_590);
      std::allocator<char>::~allocator((allocator<char> *)&local_591);
      cppcms::json::value::~value((value *)0x11adcc);
      cppcms::json::value::value<char[14]>
                (in_stack_fffffffffffff650,(char (*) [14])in_stack_fffffffffffff648);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5e8,"cache",&local_5e9);
      psVar3 = (string *)cppcms::json::value::operator[]((string *)&local_50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_610,"backend",&local_611);
      cppcms::json::value::operator[](psVar3);
      cppcms::json::value::operator=((value *)in_stack_fffffffffffff640,in_stack_fffffffffffff638);
      std::__cxx11::string::~string(local_610);
      std::allocator<char>::~allocator((allocator<char> *)&local_611);
      std::__cxx11::string::~string(local_5e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
      cppcms::json::value::~value((value *)0x11aec6);
      local_624 = 100;
      cppcms::json::value::value<int>(in_stack_fffffffffffff650,(int *)in_stack_fffffffffffff648);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_648,"cache",&local_649);
      psVar3 = (string *)cppcms::json::value::operator[]((string *)&local_50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_670,"limit",&local_671);
      this_00 = (test_app *)cppcms::json::value::operator[](psVar3);
      cppcms::json::value::operator=((value *)in_stack_fffffffffffff640,in_stack_fffffffffffff638);
      std::__cxx11::string::~string(local_670);
      std::allocator<char>::~allocator((allocator<char> *)&local_671);
      std::__cxx11::string::~string(local_648);
      std::allocator<char>::~allocator((allocator<char> *)&local_649);
      cppcms::json::value::~value((value *)0x11afcc);
      cppcms::service::service(local_680,&local_50);
      test_app::test_app(in_stack_fffffffffffff770,(service *)in_stack_fffffffffffff768);
      test_app::test_buffer(in_stack_000003d0);
      test_app::set_context(this_01);
      test_app::test_skins(in_stack_fffffffffffffe00);
      test_app::test_views(in_stack_fffffffffffffb80);
      test_app::test_templates(in_stack_fffffffffffff960);
      test_app::test_if(in_stack_fffffffffffffb80);
      test_app::test_url(in_stack_fffffffffffff7c0);
      test_app::test_foreach(in_stack_fffffffffffffda0);
      test_app::test_format(in_stack_fffffffffffff7c0);
      test_app::test_forms(in_stack_fffffffffffffd40);
      test_app::test_block_filter(in_stack_fffffffffffff7c0);
      test_app::test_cache(in_stack_00001910);
      test_app::test_using_render(in_stack_fffffffffffff7c0);
      test_app::test_gettext(in_stack_fffffffffffff7c0);
      if ((local_41 & 1) != 0) {
        test_app::test_using_from(this);
        test_app::test_domain(in_stack_fffffffffffffc00);
      }
      test_app::~test_app(this_00);
      cppcms::service::~service(local_680);
      cppcms::json::value::~value((value *)0x11b32e);
      poVar5 = std::operator<<((ostream *)&std::cout,"Ok");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      local_4 = 0;
      goto LAB_0011b445;
    }
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,"Usage (--separate|--shared) /path/to/tests/dir");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  local_4 = 1;
LAB_0011b445:
  local_40 = 1;
  std::__cxx11::string::~string(local_30);
  return local_4;
}

Assistant:

int main(int argc,char **argv)
{
	std::string type;
	if(argc!=3 || ((type=argv[1])!="--separate" && type!="--shared")) {
		std::cerr << "Usage (--separate|--shared) /path/to/tests/dir" << std::endl;
		return 1;
	}
	bool separate = type == "--separate";
	try {
		cppcms::json::value cfg;
		cfg["views"]["paths"][0]="./";
		cfg["localization"]["locales"][0]="en_US.UTF-8";
		cfg["localization"]["messages"]["paths"][0]=std::string(argv[2]);
		cfg["localization"]["messages"]["domains"][0]="main";
		cfg["localization"]["messages"]["domains"][1]="plugin2";

		if(separate) {
			std::cout << "Using separate header/body" << std::endl;
			cfg["views"]["skins"][0]="tc_sep_skin_a";
			cfg["views"]["skins"][1]="tc_sep_skin_b";
			cfg["views"]["skins"][2]="tc_sep_skin";
			cfg["views"]["skins"][3]="tc_plugin";
			cfg["views"]["skins"][4]="tc_plugin2";
		}
		else {
			std::cout << "Using shared header/body" << std::endl;
			cfg["views"]["skins"][0]="tc_skin_a";
			cfg["views"]["skins"][1]="tc_skin_b";
			cfg["views"]["skins"][2]="tc_skin";
		}
		cfg["views"]["default_skin"]="tc_skin";
		cfg["cache"]["backend"]="thread_shared";
		cfg["cache"]["limit"]=100;
		cppcms::service srv(cfg);
		test_app app(srv);

		app.test_buffer();

		app.set_context();

		app.test_skins();
		app.test_views();
		app.test_templates();
		app.test_if();
		app.test_url();
		app.test_foreach();
		app.test_format();
		app.test_forms();
		app.test_block_filter();
		app.test_cache();
		app.test_using_render();
		app.test_gettext();
		if(separate) {
			app.test_using_from();
			app.test_domain();
		}
	}
	catch(std::exception const &e)
	{
		std::cerr << "Fail " << e.what() << std::endl;
		return 1;
	}
	std::cout << "Ok" << std::endl;
	return 0;
}